

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void pass2_no_dither(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  short *psVar4;
  int in_ECX;
  byte *pbVar5;
  byte *pbVar6;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  JDIMENSION width;
  JDIMENSION col;
  int row;
  int c2;
  int c1;
  int c0;
  histptr cachep;
  JSAMPROW outptr;
  JSAMPROW inptr;
  hist3d histogram;
  my_cquantize_ptr_conflict cquantize;
  int in_stack_00000174;
  int in_stack_00000178;
  int in_stack_0000017c;
  j_decompress_ptr in_stack_00000180;
  int local_5c;
  int local_58;
  char *local_40;
  byte *local_38;
  
  lVar3 = *(long *)(*(long *)(in_RDI + 0x270) + 0x30);
  iVar2 = *(int *)(in_RDI + 0x88);
  for (local_58 = 0; local_58 < in_ECX; local_58 = local_58 + 1) {
    local_38 = *(byte **)(in_RSI + (long)local_58 * 8);
    local_40 = *(char **)(in_RDX + (long)local_58 * 8);
    for (local_5c = iVar2; local_5c != 0; local_5c = local_5c + -1) {
      pbVar5 = local_38 + 1;
      bVar1 = *local_38;
      pbVar6 = local_38 + 2;
      local_38 = local_38 + 3;
      psVar4 = (short *)(*(long *)(lVar3 + (long)((int)(uint)bVar1 >> 3) * 8) +
                         (long)((int)(uint)*pbVar5 >> 2) * 0x40 +
                        (long)((int)(uint)*pbVar6 >> 3) * 2);
      if (*psVar4 == 0) {
        fill_inverse_cmap(in_stack_00000180,in_stack_0000017c,in_stack_00000178,in_stack_00000174);
      }
      *local_40 = (char)*psVar4 + -1;
      local_40 = local_40 + 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
pass2_no_dither(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                JSAMPARRAY output_buf, int num_rows)
/* This version performs no dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  register JSAMPROW inptr, outptr;
  register histptr cachep;
  register int c0, c1, c2;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    inptr = input_buf[row];
    outptr = output_buf[row];
    for (col = width; col > 0; col--) {
      /* get pixel value and index into the cache */
      c0 = (*inptr++) >> C0_SHIFT;
      c1 = (*inptr++) >> C1_SHIFT;
      c2 = (*inptr++) >> C2_SHIFT;
      cachep = &histogram[c0][c1][c2];
      /* If we have not seen this color before, find nearest colormap entry */
      /* and update the cache */
      if (*cachep == 0)
        fill_inverse_cmap(cinfo, c0, c1, c2);
      /* Now emit the colormap index for this cell */
      *outptr++ = (JSAMPLE)(*cachep - 1);
    }
  }
}